

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleImageTests.cpp
# Opt level: O1

Move<vk::Handle<(vk::HandleType)9>_> *
vkt::pipeline::anon_unknown_0::makeImage
          (Move<vk::Handle<(vk::HandleType)9>_> *__return_storage_ptr__,DeviceInterface *vk,
          VkDevice device,VkFormat format,IVec2 *size,deUint32 numLayers,
          VkSampleCountFlagBits samples,VkImageUsageFlags usage)

{
  VkImageCreateInfo local_68;
  
  local_68.sType = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
  local_68.pNext = (void *)0x0;
  local_68.flags = 0;
  local_68.imageType = VK_IMAGE_TYPE_2D;
  local_68.extent._0_8_ = *(undefined8 *)size->m_data;
  local_68.extent.depth = 1;
  local_68.mipLevels = 1;
  local_68.samples = samples;
  local_68.tiling = VK_IMAGE_TILING_OPTIMAL;
  local_68.usage = usage;
  local_68.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  local_68.queueFamilyIndexCount = 0;
  local_68.pQueueFamilyIndices = (deUint32 *)0x0;
  local_68.initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  local_68.format = format;
  local_68.arrayLayers = numLayers;
  ::vk::createImage(__return_storage_ptr__,vk,device,&local_68,(VkAllocationCallbacks *)0x0);
  return __return_storage_ptr__;
}

Assistant:

Move<VkImage> makeImage (const DeviceInterface& vk, const VkDevice device, const VkFormat format, const IVec2& size, const deUint32 numLayers, const VkSampleCountFlagBits samples, const VkImageUsageFlags usage)
{
	const VkImageCreateInfo imageParams =
	{
		VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO,			// VkStructureType			sType;
		DE_NULL,										// const void*				pNext;
		(VkImageCreateFlags)0,							// VkImageCreateFlags		flags;
		VK_IMAGE_TYPE_2D,								// VkImageType				imageType;
		format,											// VkFormat					format;
		makeExtent3D(size.x(), size.y(), 1),			// VkExtent3D				extent;
		1u,												// deUint32					mipLevels;
		numLayers,										// deUint32					arrayLayers;
		samples,										// VkSampleCountFlagBits	samples;
		VK_IMAGE_TILING_OPTIMAL,						// VkImageTiling			tiling;
		usage,											// VkImageUsageFlags		usage;
		VK_SHARING_MODE_EXCLUSIVE,						// VkSharingMode			sharingMode;
		0u,												// deUint32					queueFamilyIndexCount;
		DE_NULL,										// const deUint32*			pQueueFamilyIndices;
		VK_IMAGE_LAYOUT_UNDEFINED,						// VkImageLayout			initialLayout;
	};
	return createImage(vk, device, &imageParams);
}